

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_shared_code_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::SharedCodeGenerator::GenerateDescriptors
          (SharedCodeGenerator *this,Printer *printer)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ClassNameResolver *this_00;
  FileDescriptor *pFVar3;
  long *plVar4;
  undefined8 *puVar5;
  undefined1 immutable;
  ulong *puVar7;
  char *text;
  undefined8 uVar8;
  long lVar9;
  int index;
  ulong uVar10;
  string classname;
  string filename;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  dependencies;
  string file_data;
  FileDescriptorProto file_proto;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string local_1e8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c8;
  string local_188;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_168;
  string local_148;
  string local_128;
  FileDescriptorProto local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  
  FileDescriptorProto::FileDescriptorProto(&local_108);
  FileDescriptor::CopyTo(this->file_,&local_108);
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  local_148._M_string_length = 0;
  local_148.field_2._M_local_buf[0] = '\0';
  MessageLite::SerializeToString((MessageLite *)&local_108,&local_148);
  io::Printer::Print(printer,"java.lang.String[] descriptorData = {\n");
  io::Printer::Indent(printer);
  if (local_148._M_string_length != 0) {
    uVar10 = 0;
    do {
      if (uVar10 != 0) {
        text = ",\n";
        if ((int)((uVar10 & 0xffffffff) / 400) * -400 + (int)uVar10 != 0) {
          text = " +\n";
        }
        io::Printer::Print(printer,text);
      }
      std::__cxx11::string::substr((ulong)&local_1e8,(ulong)&local_148);
      CEscape(&local_1c8.first,&local_1e8);
      io::Printer::Print(printer,"\"$data$\"","data",&local_1c8.first);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8.first._M_dataplus._M_p != &local_1c8.first.field_2) {
        operator_delete(local_1c8.first._M_dataplus._M_p,
                        local_1c8.first.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      uVar10 = uVar10 + 0x28;
    } while (uVar10 < local_148._M_string_length);
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"\n};\n");
  io::Printer::Print(printer,
                     "com.google.protobuf.Descriptors.FileDescriptor.InternalDescriptorAssigner assigner =\n    new com.google.protobuf.Descriptors.FileDescriptor.    InternalDescriptorAssigner() {\n      public com.google.protobuf.ExtensionRegistry assignDescriptors(\n          com.google.protobuf.Descriptors.FileDescriptor root) {\n        descriptor = root;\n        return null;\n      }\n    };\n"
                    );
  local_168.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pFVar3 = this->file_;
  if (0 < *(int *)(pFVar3 + 0x18)) {
    paVar2 = &local_1c8.first.field_2;
    index = 0;
    do {
      pFVar3 = FileDescriptor::dependency(pFVar3,index);
      paVar6 = &local_1e8.field_2;
      lVar9 = **(long **)pFVar3;
      local_1e8._M_dataplus._M_p = (pointer)paVar6;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e8,lVar9,(*(long **)pFVar3)[1] + lVar9);
      immutable = SUB81(paVar6,0);
      pFVar3 = FileDescriptor::dependency(this->file_,index);
      FileJavaPackage_abi_cxx11_(&local_128,(java *)pFVar3,(FileDescriptor *)0x1,(bool)immutable);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_128);
      puVar7 = (ulong *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar7) {
        local_1c8.first.field_2._M_allocated_capacity = *puVar7;
        local_1c8.first.field_2._8_8_ = plVar4[3];
        local_1c8.first._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_1c8.first.field_2._M_allocated_capacity = *puVar7;
        local_1c8.first._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_1c8.first._M_string_length = plVar4[1];
      *plVar4 = (long)puVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      this_00 = (this->name_resolver_).ptr_;
      if (this_00 == (ClassNameResolver *)0x0) {
        __assert_fail("ptr_ != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                      ,0x5f,
                      "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::ClassNameResolver>::operator->() const [C = google::protobuf::compiler::java::ClassNameResolver]"
                     );
      }
      pFVar3 = FileDescriptor::dependency(this->file_,index);
      ClassNameResolver::GetDescriptorClassName_abi_cxx11_(&local_188,this_00,pFVar3);
      uVar8 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8.first._M_dataplus._M_p != paVar2) {
        uVar8 = local_1c8.first.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar8 < local_188._M_string_length + local_1c8.first._M_string_length) {
        uVar8 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          uVar8 = local_188.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar8 < local_188._M_string_length + local_1c8.first._M_string_length)
        goto LAB_0027afd7;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_188,0,(char *)0x0,(ulong)local_1c8.first._M_dataplus._M_p)
        ;
      }
      else {
LAB_0027afd7:
        puVar5 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_1c8,(ulong)local_188._M_dataplus._M_p);
      }
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      psVar1 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar1) {
        local_208.field_2._M_allocated_capacity = *psVar1;
        local_208.field_2._8_8_ = puVar5[3];
      }
      else {
        local_208.field_2._M_allocated_capacity = *psVar1;
        local_208._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_208._M_string_length = puVar5[1];
      *puVar5 = psVar1;
      puVar5[1] = 0;
      *(undefined1 *)psVar1 = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8.first._M_dataplus._M_p != paVar2) {
        operator_delete(local_1c8.first._M_dataplus._M_p,
                        local_1c8.first.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_1c8,&local_1e8,&local_208);
      std::
      vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                  *)&local_168,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8.second._M_dataplus._M_p != &local_1c8.second.field_2) {
        operator_delete(local_1c8.second._M_dataplus._M_p,
                        local_1c8.second.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8.first._M_dataplus._M_p != paVar2) {
        operator_delete(local_1c8.first._M_dataplus._M_p,
                        local_1c8.first.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      index = index + 1;
      pFVar3 = this->file_;
    } while (index < *(int *)(pFVar3 + 0x18));
  }
  io::Printer::Print(printer,
                     "com.google.protobuf.Descriptors.FileDescriptor\n  .internalBuildGeneratedFileFrom(descriptorData,\n"
                    );
  io::Printer::Print(printer,"    new com.google.protobuf.Descriptors.FileDescriptor[] {\n");
  if (local_168.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_168.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar9 = 0x20;
    uVar10 = 0;
    do {
      io::Printer::Print(printer,"      $dependency$.getDescriptor(),\n","dependency",
                         (string *)
                         ((long)&((local_168.
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus.
                                 _M_p + lVar9));
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x40;
    } while (uVar10 < (ulong)((long)local_168.
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_168.
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 6));
  }
  io::Printer::Print(printer,"    }, assigner);\n");
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,
                    CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                             local_148.field_2._M_local_buf[0]) + 1);
  }
  FileDescriptorProto::~FileDescriptorProto(&local_108);
  return;
}

Assistant:

void SharedCodeGenerator::GenerateDescriptors(io::Printer* printer) {
  // Embed the descriptor.  We simply serialize the entire FileDescriptorProto
  // and embed it as a string literal, which is parsed and built into real
  // descriptors at initialization time.  We unfortunately have to put it in
  // a string literal, not a byte array, because apparently using a literal
  // byte array causes the Java compiler to generate *instructions* to
  // initialize each and every byte of the array, e.g. as if you typed:
  //   b[0] = 123; b[1] = 456; b[2] = 789;
  // This makes huge bytecode files and can easily hit the compiler's internal
  // code size limits (error "code to large").  String literals are apparently
  // embedded raw, which is what we want.
  FileDescriptorProto file_proto;
  file_->CopyTo(&file_proto);

  string file_data;
  file_proto.SerializeToString(&file_data);

  printer->Print(
    "java.lang.String[] descriptorData = {\n");
  printer->Indent();

  // Only write 40 bytes per line.
  static const int kBytesPerLine = 40;
  for (int i = 0; i < file_data.size(); i += kBytesPerLine) {
    if (i > 0) {
      // Every 400 lines, start a new string literal, in order to avoid the
      // 64k length limit.
      if (i % 400 == 0) {
        printer->Print(",\n");
      } else {
        printer->Print(" +\n");
      }
    }
    printer->Print("\"$data$\"",
      "data", CEscape(file_data.substr(i, kBytesPerLine)));
  }

  printer->Outdent();
  printer->Print("\n};\n");

  // -----------------------------------------------------------------
  // Create the InternalDescriptorAssigner.

  printer->Print(
    "com.google.protobuf.Descriptors.FileDescriptor."
    "InternalDescriptorAssigner assigner =\n"
    "    new com.google.protobuf.Descriptors.FileDescriptor."
    "    InternalDescriptorAssigner() {\n"
    "      public com.google.protobuf.ExtensionRegistry assignDescriptors(\n"
    "          com.google.protobuf.Descriptors.FileDescriptor root) {\n"
    "        descriptor = root;\n"
    // Custom options will be handled when immutable messages' outer class is
    // loaded. Here we just return null and let custom options be unknown
    // fields.
    "        return null;\n"
    "      }\n"
    "    };\n");

  // -----------------------------------------------------------------
  // Find out all dependencies.
  std::vector<std::pair<string, string> > dependencies;
  for (int i = 0; i < file_->dependency_count(); i++) {
    string filename = file_->dependency(i)->name();
    string classname = FileJavaPackage(file_->dependency(i)) + "." +
                       name_resolver_->GetDescriptorClassName(
                           file_->dependency(i));
    dependencies.push_back(std::make_pair(filename, classname));
  }

  // -----------------------------------------------------------------
  // Invoke internalBuildGeneratedFileFrom() to build the file.
  printer->Print(
    "com.google.protobuf.Descriptors.FileDescriptor\n"
    "  .internalBuildGeneratedFileFrom(descriptorData,\n");
  printer->Print(
    "    new com.google.protobuf.Descriptors.FileDescriptor[] {\n");

  for (int i = 0; i < dependencies.size(); i++) {
    const string& dependency = dependencies[i].second;
    printer->Print(
        "      $dependency$.getDescriptor(),\n",
        "dependency", dependency);
  }

  printer->Print(
    "    }, assigner);\n");
}